

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::substitute
          (HPresolve *this,HighsInt substcol,HighsInt staycol,double offset,double scale)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  reference pvVar5;
  reference pvVar6;
  int in_EDX;
  int in_ESI;
  HPresolve *in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double unaff_retaddr;
  HighsInt in_stack_00000008;
  HighsInt in_stack_0000000c;
  HPresolve *in_stack_00000010;
  HighsInt colpos;
  double colval;
  HighsInt colrow;
  HighsInt coliter;
  uint local_24;
  double dVar7;
  
  puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->colhead,(long)in_ESI)
  ;
  local_24 = *puVar4;
  while (local_24 != 0xffffffff) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->Arow,(long)(int)local_24);
    iVar2 = *pvVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->Avalue,(long)(int)local_24);
    dVar1 = *pvVar6;
    puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->Anext,(long)(int)local_24);
    uVar3 = *puVar4;
    unlink(in_RDI,(char *)(ulong)local_24);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_lower_,(long)iVar2);
    if ((*pvVar6 != -INFINITY) || (NAN(*pvVar6))) {
      dVar7 = in_XMM0_Qa;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_lower_,(long)iVar2);
      *pvVar6 = -dVar1 * in_XMM0_Qa + *pvVar6;
      in_XMM0_Qa = dVar7;
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->row_upper_,(long)iVar2);
    if ((*pvVar6 != INFINITY) || (NAN(*pvVar6))) {
      dVar7 = in_XMM0_Qa;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->row_upper_,(long)iVar2);
      *pvVar6 = -dVar1 * in_XMM0_Qa + *pvVar6;
      in_XMM0_Qa = dVar7;
    }
    addToMatrix(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    reinsertEquation((HPresolve *)CONCAT44(in_ESI,in_EDX),(HighsInt)((ulong)in_XMM0_Qa >> 0x20));
    local_24 = uVar3;
  }
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&in_RDI->model->col_cost_,(long)in_ESI);
  if ((*pvVar6 != 0.0) || (NAN(*pvVar6))) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_cost_,(long)in_ESI);
    in_RDI->model->offset_ = *pvVar6 * in_XMM0_Qa + in_RDI->model->offset_;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_cost_,(long)in_ESI);
    dVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_cost_,(long)in_EDX);
    *pvVar6 = in_XMM1_Qa * dVar1 + *pvVar6;
    this_00 = &in_RDI->model->col_cost_;
    std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)in_EDX);
    std::abs((int)this_00);
    if (extraout_XMM0_Qa <= (in_RDI->options->super_HighsOptionsStruct).small_matrix_value) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->model->col_cost_,(long)in_EDX);
      *pvVar6 = 0.0;
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->model->col_cost_,(long)in_ESI);
    *pvVar6 = 0.0;
  }
  return;
}

Assistant:

void HPresolve::substitute(HighsInt substcol, HighsInt staycol, double offset,
                           double scale) {
  // substitute the column in each row where it occurs
  for (HighsInt coliter = colhead[substcol]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];
    // walk to the next position before doing any modifications, because
    // the current position will be deleted in the loop below
    assert(Acol[coliter] == substcol);
    HighsInt colpos = coliter;
    coliter = Anext[coliter];
    assert(!rowDeleted[colrow]);
    unlink(colpos);

    // adjust the sides
    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] -= colval * offset;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] -= colval * offset;

    addToMatrix(colrow, staycol, scale * colval);
    // printf("after substitution: ");
    // debugPrintRow(colrow);

    // check if this is an equation row and it now has a different size
    reinsertEquation(colrow);
  }

  // substitute column in the objective function
  if (model->col_cost_[substcol] != 0.0) {
    model->offset_ += model->col_cost_[substcol] * offset;
    assert(std::isfinite(model->offset_));

    model->col_cost_[staycol] += scale * model->col_cost_[substcol];

    if (std::abs(model->col_cost_[staycol]) <= options->small_matrix_value)
      model->col_cost_[staycol] = 0.0;
    model->col_cost_[substcol] = 0.0;
  }
}